

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildTokenTestDoNotStartWithoutToken::Run(BuildTokenTestDoNotStartWithoutToken *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  size_type sVar4;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string err;
  BuildTokenTestDoNotStartWithoutToken *this_local;
  
  err.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cat1",&local_51);
  pNVar3 = Builder::AddTarget(&(this->super_BuildTokenTest).super_BuildTest.builder_,&local_50,
                              (string *)local_30);
  testing::Test::Check
            (pTVar1,pNVar3 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1045,"builder_.AddTarget(\"cat1\", &err)");
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_30);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x1046,"\"\" == err");
  if (bVar2) {
    BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,1);
    BuildTokenTest::ExpectAcquireToken(&this->super_BuildTokenTest,1,0);
    pTVar1 = g_current_test;
    bVar2 = Builder::Build(&(this->super_BuildTokenTest).super_BuildTest.builder_,(string *)local_30
                          );
    testing::Test::Check
              (pTVar1,(bool)(~bVar2 & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x104c,"builder_.Build(&err)");
    pTVar1 = g_current_test;
    bVar2 = std::operator==("stuck [this is a bug]",
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x104d,"\"stuck [this is a bug]\" == err");
    pTVar1 = g_current_test;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_BuildTokenTest).token_command_runner_.commands_ran_);
    testing::Test::Check
              (pTVar1,sVar4 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x104f,"0u == token_command_runner_.commands_ran_.size()");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(BuildTokenTest, DoNotStartWithoutToken) {
  // plan should execute one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat1", &err));
  ASSERT_EQ("", err);

  // we could run a command but do not have a token for it
  ExpectCanRunMore(1,   true);
  ExpectAcquireToken(1, false);

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("stuck [this is a bug]", err);

  EXPECT_EQ(0u, token_command_runner_.commands_ran_.size());
}